

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

DiskType checkBluRayMux(char *metaFileName,int *autoChapterLen,
                       vector<double,_std::allocator<double>_> *customChaptersList,
                       int *firstMplsOffset,int *firstM2tsOffset,bool *insertBlankPL,int *blankNum,
                       bool *stereoMode,string *isoDiskLabel)

{
  iterator __position;
  pointer pbVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int32_t iVar5;
  long lVar6;
  undefined4 *puVar7;
  string *chap;
  string *chapterStr;
  DiskType DVar8;
  string *value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  ostringstream ss;
  TextFile file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  string local_2a0;
  int *local_280;
  int *local_278;
  uint *local_270;
  undefined8 local_268;
  uint local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  uint *local_250;
  undefined8 local_248;
  uint local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  uint *local_230;
  undefined8 local_228;
  uint local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  bool *local_210;
  int *local_208;
  double local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  undefined1 local_1e0 [376];
  File local_68;
  
  *autoChapterLen = 0;
  DVar8 = NONE;
  *stereoMode = false;
  local_280 = firstM2tsOffset;
  local_278 = firstMplsOffset;
  local_210 = insertBlankPL;
  local_208 = autoChapterLen;
  File::File(&local_68,metaFileName,1,0);
  local_68.super_AbstractOutputStream.super_AbstractStream._vptr_AbstractStream =
       (AbstractStream)&PTR__File_0023ddc8;
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  local_2a0._M_string_length = 0;
  local_2a0.field_2._M_local_buf[0] = '\0';
  TextFile::readLine((TextFile *)&local_68,&local_2a0);
  do {
    if (local_2a0._M_string_length == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,
                        CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                 local_2a0.field_2._M_local_buf[0]) + 1);
      }
      File::~File(&local_68);
      return DVar8;
    }
    local_1e0._0_8_ = local_1e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"MUXOPT","");
    bVar3 = strStartWith(&local_2a0,(string *)local_1e0);
    if ((string *)local_1e0._0_8_ != (string *)(local_1e0 + 0x10)) {
      operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    }
    if (bVar3) {
      splitQuotedStr_abi_cxx11_(&local_1f8,local_2a0._M_dataplus._M_p,' ');
      pbVar1 = local_1f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (value = local_1f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; value != pbVar1; value = value + 1) {
        trimStr((string *)local_1e0,value);
        splitStr_abi_cxx11_(&local_2b8,(char *)local_1e0._0_8_,'=');
        if ((string *)local_1e0._0_8_ != (string *)(local_1e0 + 0x10)) {
          operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
        }
        if (local_2b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_2b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar4 = std::__cxx11::string::compare
                            ((char *)local_2b8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
          if (iVar4 == 0) {
            iVar5 = strToInt32(local_2b8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
            *local_208 = iVar5 * 0x3c;
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)local_2b8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            if ((iVar4 == 0) &&
               (0x20 < (ulong)((long)local_2b8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2b8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start))) {
              splitStr_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_1e0,
                                  local_2b8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,';')
              ;
              uVar2 = local_1e0._8_8_;
              for (chapterStr = (string *)local_1e0._0_8_; chapterStr != (string *)uVar2;
                  chapterStr = chapterStr + 1) {
                local_200 = timeToFloat(chapterStr);
                __position._M_current =
                     (customChaptersList->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (customChaptersList->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (customChaptersList,__position,&local_200);
                }
                else {
                  *__position._M_current = local_200;
                  (customChaptersList->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1e0);
            }
            else {
              iVar4 = std::__cxx11::string::compare
                                ((char *)local_2b8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              if (iVar4 == 0) {
                iVar5 = strToInt32(local_2b8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
                *local_278 = iVar5;
                if (1999 < iVar5) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e0,"Too large m2ts offset ",0x16);
                  std::ostream::operator<<((ostream *)local_1e0,*local_278);
                  puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
                  std::__cxx11::stringbuf::str();
                  *puVar7 = 3;
                  *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
                  if (local_230 == &local_220) {
                    puVar7[6] = local_220;
                    puVar7[7] = uStack_21c;
                    puVar7[8] = uStack_218;
                    puVar7[9] = uStack_214;
                  }
                  else {
                    *(uint **)(puVar7 + 2) = local_230;
                    *(ulong *)(puVar7 + 6) = CONCAT44(uStack_21c,local_220);
                  }
                  *(undefined8 *)(puVar7 + 4) = local_228;
                  local_228 = 0;
                  local_220 = local_220 & 0xffffff00;
                  local_230 = &local_220;
                  __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException
                             );
                }
              }
              else {
                iVar4 = std::__cxx11::string::compare
                                  ((char *)local_2b8.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
                if (iVar4 == 0) {
                  iVar5 = strToInt32(local_2b8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
                  *blankNum = iVar5;
                  if (1999 < iVar5) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,"Too large black playlist offset ",0x20);
                    std::ostream::operator<<((ostream *)local_1e0,*blankNum);
                    puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
                    std::__cxx11::stringbuf::str();
                    *puVar7 = 3;
                    *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
                    if (local_250 == &local_240) {
                      puVar7[6] = local_240;
                      puVar7[7] = uStack_23c;
                      puVar7[8] = uStack_238;
                      puVar7[9] = uStack_234;
                    }
                    else {
                      *(uint **)(puVar7 + 2) = local_250;
                      *(ulong *)(puVar7 + 6) = CONCAT44(uStack_23c,local_240);
                    }
                    *(undefined8 *)(puVar7 + 4) = local_248;
                    local_248 = 0;
                    local_240 = local_240 & 0xffffff00;
                    local_250 = &local_240;
                    __cxa_throw(puVar7,&VodCoreException::typeinfo,
                                VodCoreException::~VodCoreException);
                  }
                }
                else {
                  iVar4 = std::__cxx11::string::compare
                                    ((char *)local_2b8.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  if (iVar4 == 0) {
                    iVar5 = strToInt32(local_2b8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p
                                      );
                    *local_280 = iVar5;
                    if (99999 < iVar5) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e0,"Too large m2ts offset ",0x16);
                      std::ostream::operator<<((ostream *)local_1e0,*local_280);
                      puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
                      std::__cxx11::stringbuf::str();
                      *puVar7 = 3;
                      *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
                      if (local_270 == &local_260) {
                        puVar7[6] = local_260;
                        puVar7[7] = uStack_25c;
                        puVar7[8] = uStack_258;
                        puVar7[9] = uStack_254;
                      }
                      else {
                        *(uint **)(puVar7 + 2) = local_270;
                        *(ulong *)(puVar7 + 6) = CONCAT44(uStack_25c,local_260);
                      }
                      *(undefined8 *)(puVar7 + 4) = local_268;
                      local_268 = 0;
                      local_260 = local_260 & 0xffffff00;
                      local_270 = &local_260;
                      __cxa_throw(puVar7,&VodCoreException::typeinfo,
                                  VodCoreException::~VodCoreException);
                    }
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare
                                      ((char *)local_2b8.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
                    if (iVar4 == 0) {
                      *local_210 = true;
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare
                                        ((char *)local_2b8.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start);
                      if (iVar4 == 0) {
                        std::__cxx11::string::_M_assign((string *)isoDiskLabel);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2b8);
      }
      lVar6 = std::__cxx11::string::find((char *)&local_2a0,0x206b21,0);
      if (lVar6 != -1) {
        V3_flags._0_1_ = (byte)V3_flags | 1;
      }
      lVar6 = std::__cxx11::string::find((char *)&local_2a0,0x206b2e,0);
      DVar8 = BLURAY;
      if (lVar6 == -1) {
        lVar6 = std::__cxx11::string::find((char *)&local_2a0,0x206b38,0);
        DVar8 = (uint)(lVar6 != -1) * 2;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1f8);
    }
    else {
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"V_MPEG4/ISO/MVC","");
      bVar3 = strStartWith(&local_2a0,(string *)local_1e0);
      if ((string *)local_1e0._0_8_ != (string *)(local_1e0 + 0x10)) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
      if (bVar3) {
        *stereoMode = true;
      }
    }
    TextFile::readLine((TextFile *)&local_68,&local_2a0);
  } while( true );
}

Assistant:

DiskType checkBluRayMux(const char* metaFileName, int& autoChapterLen, vector<double>& customChaptersList,
                        int& firstMplsOffset, int& firstM2tsOffset, bool& insertBlankPL, int& blankNum,
                        bool& stereoMode, std::string& isoDiskLabel)
{
    autoChapterLen = 0;
    stereoMode = false;
    TextFile file(metaFileName, File::ofRead);
    string str;
    file.readLine(str);
    DiskType result = DiskType::NONE;
    while (str.length() > 0)
    {
        if (strStartWith(str, "MUXOPT"))
        {
            vector<string> params = splitQuotedStr(str.c_str(), ' ');
            for (const auto& param : params)
            {
                vector<string> paramPair = splitStr(trimStr(param).c_str(), '=');
                if (paramPair.empty())
                    continue;
                if (paramPair[0] == "--auto-chapters")
                    autoChapterLen = strToInt32(paramPair[1].c_str()) * 60;
                else if (paramPair[0] == "--custom-chapters" && paramPair.size() > 1)
                {
                    vector<string> chapList = splitStr(paramPair[1].c_str(), ';');
                    for (const string& chap : chapList) customChaptersList.push_back(timeToFloat(chap));
                }
                else if (paramPair[0] == "--mplsOffset")
                {
                    firstMplsOffset = strToInt32(paramPair[1].c_str());
                    if (firstMplsOffset > 1999)
                        THROW(ERR_COMMON, "Too large m2ts offset " << firstMplsOffset)
                }
                else if (paramPair[0] == "--blankOffset")
                {
                    blankNum = strToInt32(paramPair[1].c_str());
                    if (blankNum > 1999)
                        THROW(ERR_COMMON, "Too large black playlist offset " << blankNum)
                }
                else if (paramPair[0] == "--m2tsOffset")
                {
                    firstM2tsOffset = strToInt32(paramPair[1].c_str());
                    if (firstM2tsOffset > 99999)
                        THROW(ERR_COMMON, "Too large m2ts offset " << firstM2tsOffset)
                }
                else if (paramPair[0] == "--insertBlankPL")
                    insertBlankPL = true;
                else if (paramPair[0] == "--label")
                {
                    isoDiskLabel = paramPair[1];
                }
            }

            if (str.find("--blu-ray-v3") != string::npos)
                V3_flags |= HDMV_V3;

            if (str.find("--blu-ray") != string::npos)
                result = DiskType::BLURAY;
            else if (str.find("--avchd") != string::npos)
                result = DiskType::AVCHD;
            else
                result = DiskType::NONE;
        }
        else if (strStartWith(str, "V_MPEG4/ISO/MVC"))
            stereoMode = true;

        file.readLine(str);
    }
    return result;
}